

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSyncTests.cpp
# Opt level: O3

void __thiscall deqp::gles3::Stress::FenceSyncCase::~FenceSyncCase(FenceSyncCase *this)

{
  pointer pp_Var1;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FenceSyncCase_0215bb48;
  deinit(this);
  pp_Var1 = (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (pp_Var1 != (pointer)0x0) {
    operator_delete(pp_Var1,(long)(this->m_syncObjects).
                                  super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pp_Var1)
    ;
  }
  glu::CallLogWrapper::~CallLogWrapper(&this->super_CallLogWrapper);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

FenceSyncCase::~FenceSyncCase (void)
{
	FenceSyncCase::deinit();
}